

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O2

void destroy_expectation_if_time_to_die(RecordedExpectation *expectation)

{
  char *__s2;
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  
  iVar3 = expectation->time_to_live;
  if ((iVar3 == 0xf314159) || (expectation->time_to_live = iVar3 + -1, 1 < iVar3)) {
    return;
  }
  __s2 = expectation->function;
  iVar3 = 0;
  do {
    iVar1 = cgreen_vector_size(global_expectation_queue);
    if (iVar1 <= iVar3) {
LAB_0010a26b:
      destroy_expectation(expectation);
      return;
    }
    puVar2 = (undefined8 *)cgreen_vector_get(global_expectation_queue,iVar3);
    if (puVar2 == (undefined8 *)0x0) {
      __fprintf_chk(_stderr,1,
                    "*** CGREEN: NULL expectation found -- maybe a previous incorrect removal?");
    }
    else {
      iVar1 = strcmp((char *)*puVar2,__s2);
      if (iVar1 == 0) {
        cgreen_vector_remove(global_expectation_queue,iVar3);
        goto LAB_0010a26b;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static void destroy_expectation_if_time_to_die(RecordedExpectation *expectation) {

    if (is_always_call(expectation)) {
        return;
    }

    /* TODO: expectation->decrement_time_to_live_if_necessary(); if (expectation->time_to_die()) { ... } */
    expectation->time_to_live--;

    if (expectation->time_to_live <= 0) {
        remove_expectation_for(expectation->function);
        destroy_expectation(expectation);
    }
}